

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

void array_negation_empty_test(void)

{
  array_container_t *b;
  array_container_t *src;
  unsigned_long unaff_retaddr;
  bitset_container_t *BO;
  array_container_t *AI;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  b = array_container_create();
  src = (array_container_t *)bitset_container_create();
  array_container_negation
            (src,(bitset_container_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
            );
  bitset_container_cardinality((bitset_container_t *)src);
  _assert_int_equal(unaff_retaddr,(unsigned_long)b,(char *)src,in_stack_ffffffffffffffec);
  array_container_free((array_container_t *)0x1086b4);
  bitset_container_free((bitset_container_t *)0x1086be);
  return;
}

Assistant:

DEFINE_TEST(array_negation_empty_test) {
    array_container_t* AI = array_container_create();
    bitset_container_t* BO = bitset_container_create();

    array_container_negation(AI, BO);

    assert_int_equal(bitset_container_cardinality(BO), (1 << 16));

    array_container_free(AI);
    bitset_container_free(BO);
}